

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O2

int Abc_TruthNpnCountUniqueSort(Abc_TtStore_t *p)

{
  int iVar1;
  word **ppwVar2;
  word *__s2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  nWords = p->nWords;
  if (0 < nWords) {
    qsort(p->pFuncs,(long)p->nFuncs,8,Abc_TruthCompare);
    iVar1 = p->nFuncs;
    lVar7 = (long)nWords;
    iVar5 = 1;
    for (lVar6 = 1; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      ppwVar2 = p->pFuncs;
      __s2 = ppwVar2[lVar6];
      iVar3 = bcmp(ppwVar2[lVar6 + -1],__s2,lVar7 << 3);
      if (iVar3 != 0) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        ppwVar2[lVar4] = __s2;
      }
    }
    p->nFuncs = iVar5;
    return iVar5;
  }
  __assert_fail("nWords > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpn.c"
                ,0x86,"int Abc_TruthNpnCountUniqueSort(Abc_TtStore_t *)");
}

Assistant:

int Abc_TruthNpnCountUniqueSort( Abc_TtStore_t * p )
{
    int i, k;
    // sort them by value
    nWords = p->nWords;
    assert( nWords > 0 );
    qsort( (void *)p->pFuncs, p->nFuncs, sizeof(word *), (int(*)(const void *,const void *))Abc_TruthCompare );
    // count the number of unqiue functions
    for ( i = k = 1; i < p->nFuncs; i++ )
        if ( memcmp( p->pFuncs[i-1], p->pFuncs[i], sizeof(word) * nWords ) )
            p->pFuncs[k++] = p->pFuncs[i];
    return (p->nFuncs = k);
}